

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_add_goaway
              (nghttp2_session *session,int32_t last_stream_id,uint32_t error_code,
              uint8_t *opaque_data,size_t opaque_data_len,uint8_t aux_flags)

{
  int iVar1;
  nghttp2_mem *mem_00;
  nghttp2_outbound_item *item_00;
  int32_t local_64;
  nghttp2_mem *mem;
  nghttp2_goaway_aux_data *aux_data;
  uint8_t *opaque_data_copy;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  uint8_t aux_flags_local;
  size_t opaque_data_len_local;
  uint8_t *opaque_data_local;
  uint32_t error_code_local;
  int32_t last_stream_id_local;
  nghttp2_session *session_local;
  
  aux_data = (nghttp2_goaway_aux_data *)0x0;
  mem_00 = &session->mem;
  iVar1 = nghttp2_session_is_my_stream_id(session,last_stream_id);
  if (iVar1 != 0) {
    return -0x1f5;
  }
  if (opaque_data_len != 0) {
    if (0x4000 < opaque_data_len + 8) {
      return -0x1f5;
    }
    aux_data = (nghttp2_goaway_aux_data *)nghttp2_mem_malloc(mem_00,opaque_data_len);
    if (aux_data == (nghttp2_goaway_aux_data *)0x0) {
      return -0x385;
    }
    memcpy(aux_data,opaque_data,opaque_data_len);
  }
  item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem_00,0x98);
  if (item_00 == (nghttp2_outbound_item *)0x0) {
    nghttp2_mem_free(mem_00,aux_data);
    session_local._4_4_ = -0x385;
  }
  else {
    nghttp2_outbound_item_init(item_00);
    local_64 = last_stream_id;
    if (session->local_last_stream_id <= last_stream_id) {
      local_64 = session->local_last_stream_id;
    }
    nghttp2_frame_goaway_init
              ((nghttp2_goaway *)item_00,local_64,error_code,&aux_data->flags,opaque_data_len);
    (item_00->aux_data).goaway.flags = aux_flags;
    session_local._4_4_ = nghttp2_session_add_item(session,item_00);
    if (session_local._4_4_ == 0) {
      session_local._4_4_ = 0;
    }
    else {
      nghttp2_frame_goaway_free((nghttp2_goaway *)item_00,mem_00);
      nghttp2_mem_free(mem_00,item_00);
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_add_goaway(nghttp2_session *session, int32_t last_stream_id,
                               uint32_t error_code, const uint8_t *opaque_data,
                               size_t opaque_data_len, uint8_t aux_flags) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  uint8_t *opaque_data_copy = NULL;
  nghttp2_goaway_aux_data *aux_data;
  nghttp2_mem *mem;

  mem = &session->mem;

  if (nghttp2_session_is_my_stream_id(session, last_stream_id)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (opaque_data_len) {
    if (opaque_data_len + 8 > NGHTTP2_MAX_PAYLOADLEN) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
    opaque_data_copy = nghttp2_mem_malloc(mem, opaque_data_len);
    if (opaque_data_copy == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }
    memcpy(opaque_data_copy, opaque_data, opaque_data_len);
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    nghttp2_mem_free(mem, opaque_data_copy);
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  /* last_stream_id must not be increased from the value previously
     sent */
  last_stream_id = nghttp2_min(last_stream_id, session->local_last_stream_id);

  nghttp2_frame_goaway_init(&frame->goaway, last_stream_id, error_code,
                            opaque_data_copy, opaque_data_len);

  aux_data = &item->aux_data.goaway;
  aux_data->flags = aux_flags;

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_goaway_free(&frame->goaway, mem);
    nghttp2_mem_free(mem, item);
    return rv;
  }
  return 0;
}